

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O1

void duckdb_je_psset_remove(psset_t *psset,hpdata_t *ps)

{
  hpdata_t *phVar1;
  hpdata_t *phVar2;
  
  ps->h_in_psset = false;
  psset_stats_remove(psset,ps);
  if (ps->h_in_psset_alloc_container == true) {
    psset_alloc_container_remove(psset,ps);
  }
  psset_maybe_remove_purge_list(psset,ps);
  if (ps->h_in_psset_hugify_container == true) {
    ps->h_in_psset_hugify_container = false;
    phVar1 = (psset->to_hugify).head.qlh_first;
    if (phVar1 == ps) {
      (psset->to_hugify).head.qlh_first = (phVar1->ql_link_hugify).qre_next;
    }
    if ((psset->to_hugify).head.qlh_first == ps) {
      (psset->to_hugify).head.qlh_first = (hpdata_t *)0x0;
    }
    else {
      phVar1 = (ps->ql_link_hugify).qre_prev;
      (phVar1->ql_link_hugify).qre_next = (((ps->ql_link_hugify).qre_next)->ql_link_hugify).qre_prev
      ;
      phVar2 = (ps->ql_link_hugify).qre_next;
      (phVar2->ql_link_hugify).qre_prev = phVar1;
      phVar1 = (((ps->ql_link_hugify).qre_prev)->ql_link_hugify).qre_next;
      (ps->ql_link_hugify).qre_prev = phVar1;
      (((phVar2->ql_link_hugify).qre_prev)->ql_link_hugify).qre_next = phVar2;
      (phVar1->ql_link_hugify).qre_next = ps;
    }
  }
  return;
}

Assistant:

void
psset_remove(psset_t *psset, hpdata_t *ps) {
	hpdata_in_psset_set(ps, false);

	psset_stats_remove(psset, ps);
	if (hpdata_in_psset_alloc_container_get(ps)) {
		psset_alloc_container_remove(psset, ps);
	}
	psset_maybe_remove_purge_list(psset, ps);
	if (hpdata_in_psset_hugify_container_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, false);
		hpdata_hugify_list_remove(&psset->to_hugify, ps);
	}
}